

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.hpp
# Opt level: O0

size_t __thiscall Disa::Adjacency_Subgraph::vertex_level(Adjacency_Subgraph *this,size_t *i_vertex)

{
  source_location *psVar1;
  bool bVar2;
  source_location *location;
  ostream *poVar3;
  const_reference pvVar4;
  value_type local_148;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unsigned_long *local_18;
  size_t *i_vertex_local;
  Adjacency_Subgraph *this_local;
  
  psVar1 = (source_location *)*i_vertex;
  local_18 = i_vertex;
  i_vertex_local = &this->hash_parent;
  location = (source_location *)size_vertex(this);
  if (location <= psVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001c19e8;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    std::__cxx11::to_string(&local_f0,*local_18);
    std::operator+(&local_d0,"Local vertex index ",&local_f0);
    std::operator+(&local_b0,&local_d0," not in range [0, ");
    std::__cxx11::to_string(&local_110,*local_18);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,").");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->level_set_value);
  if (bVar2) {
    local_148 = 0;
  }
  else {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->level_set_value,*local_18);
    local_148 = *pvVar4;
  }
  return local_148;
}

Assistant:

[[nodiscard]] inline std::size_t vertex_level(const std::size_t& i_vertex) const {
    ASSERT_DEBUG(i_vertex < size_vertex(), "Local vertex index " + std::to_string(i_vertex) + " not in range [0, " +
                                           std::to_string(i_vertex) + ").");
    return level_set_value.empty() ? 0 : level_set_value[i_vertex];
  }